

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::Serialize(Model *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *poVar4;
  string *in_RDI;
  FILE *in_stack_00000010;
  string *in_stack_00000058;
  FILE *in_stack_00000060;
  FILE *file;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  size_t in_stack_00000180;
  char *in_stack_00000188;
  FILE *in_stack_00000190;
  FILE *in_stack_fffffffffffffef8;
  Model *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff80;
  int line;
  string *in_stack_ffffffffffffff88;
  string local_70 [4];
  LogSeverity in_stack_ffffffffffffff94;
  allocator local_39;
  string local_38 [36];
  Logger local_14 [5];
  
  line = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 1) {
    Logger::Logger(local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
               ,&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Serialize",(allocator *)&stack0xffffffffffffff8f);
    poVar3 = Logger::Start(in_stack_ffffffffffffff94,in_stack_ffffffffffffff88,line,in_RDI);
    poVar3 = std::operator<<(poVar3,"CHECK_NE failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd6);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"filename.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    bVar2 = (bool)std::__cxx11::string::empty();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"true");
    poVar4 = std::operator<<(poVar3," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,true);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  std::__cxx11::string::c_str();
  OpenFileOrDie(in_stack_000000d0,in_stack_000000c8);
  WriteStringToFile(in_stack_00000060,in_stack_00000058);
  WriteStringToFile(in_stack_00000060,in_stack_00000058);
  WriteDataToDisk(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  WriteDataToDisk(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  WriteDataToDisk(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  WriteDataToDisk(in_stack_00000190,in_stack_00000188,in_stack_00000180);
  serialize_w_v_b(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  Close(in_stack_00000010);
  return;
}

Assistant:

void Model::Serialize(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(filename.c_str(), "w");
#else
  FILE *file = OpenFileOrDie(filename.c_str(), "wb");
#endif
  // Write score function
  WriteStringToFile(file, score_func_);
  // Write loss function
  WriteStringToFile(file, loss_func_);
  // Write feature num
  WriteDataToDisk(file, (char*)&num_feat_, sizeof(num_feat_));
  // Write field num
  WriteDataToDisk(file, (char*)&num_field_, sizeof(num_field_));
  // Write K
  WriteDataToDisk(file, (char*)&num_K_, sizeof(num_K_));
  // Write aux_size
  WriteDataToDisk(file, (char*)&aux_size_, sizeof(aux_size_));
  // Write w
  this->serialize_w_v_b(file);
  Close(file);
}